

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

FloatParts round_to_int(FloatParts a,int rmode,int scale,float_status *s)

{
  FloatParts FVar1;
  FloatParts FVar2;
  FloatParts FVar3;
  FloatParts FVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  FloatParts FVar16;
  
  uVar12 = a._8_8_;
  uVar8 = a.frac;
  switch(a._12_4_ & 0xff) {
  case 1:
  case 3:
    return a;
  case 2:
    break;
  case 4:
  case 5:
    FVar16 = return_nan(a,s);
    return FVar16;
  default:
    iVar5 = 0x839;
    goto LAB_00cf22d0;
  }
  iVar5 = -0x10000;
  if (-0x10000 < scale) {
    iVar5 = scale;
  }
  if (0xffff < iVar5) {
    iVar5 = 0x10000;
  }
  uVar9 = a.exp + iVar5;
  uVar10 = uVar12 & 0xffffffff00000000;
  uVar13 = uVar10 + uVar9;
  if (0x3d < (int)uVar9) goto LAB_00cf218a;
  uVar6 = 0x4000000000000000;
  FVar4.exp = (int)uVar10;
  FVar4.cls = (char)(uVar10 >> 0x20);
  FVar4.sign = (_Bool)(char)(uVar10 >> 0x28);
  FVar4._14_2_ = (short)(uVar10 >> 0x30);
  FVar4.frac = 0x4000000000000000;
  FVar3.exp = (int)uVar10;
  FVar3.cls = (char)(uVar10 >> 0x20);
  FVar3.sign = (_Bool)(char)(uVar10 >> 0x28);
  FVar3._14_2_ = (short)(uVar10 >> 0x30);
  FVar3.frac = 0x4000000000000000;
  FVar2.exp = (int)uVar10;
  FVar2.cls = (char)(uVar10 >> 0x20);
  FVar2.sign = (_Bool)(char)(uVar10 >> 0x28);
  FVar2._14_2_ = (short)(uVar10 >> 0x30);
  FVar2.frac = 0x4000000000000000;
  FVar16.exp = (int)uVar10;
  FVar16.cls = (char)(uVar10 >> 0x20);
  FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
  FVar16._14_2_ = (short)(uVar10 >> 0x30);
  FVar16.frac = 0x4000000000000000;
  if (-1 < (int)uVar9) {
    uVar7 = 0x4000000000000000 >> ((byte)uVar9 & 0x3f);
    uVar6 = 0x2000000000000000 >> ((byte)uVar9 & 0x3f);
    if (5 < (uint)rmode) {
      iVar5 = 0x829;
      goto LAB_00cf22d0;
    }
    uVar14 = uVar7 - 1 | uVar7;
    uVar11 = uVar14 >> 1;
    switch(rmode) {
    case 0:
      if ((uVar14 & uVar8) == uVar6) {
        uVar6 = 0;
      }
      break;
    case 1:
      uVar6 = (long)(uVar12 << 0x17) >> 0x3f & uVar11;
      break;
    case 2:
      uVar6 = 0;
      if ((uVar12 >> 0x28 & 1) == 0) {
        uVar6 = uVar11;
      }
      break;
    case 3:
      uVar6 = 0;
      break;
    case 5:
      uVar6 = 0;
      if ((uVar7 & uVar8) == 0) {
        uVar6 = uVar11;
      }
    }
    if ((uVar11 & uVar8) != 0) {
      s->float_exception_flags = s->float_exception_flags | 0x20;
      uVar6 = uVar6 + uVar8;
      uVar8 = ~uVar11 & uVar6;
      if ((long)uVar6 < 0) {
        FVar1._8_8_ = uVar10 + uVar9 + 1;
        FVar1.frac = uVar8 >> 1;
        return FVar1;
      }
    }
    goto LAB_00cf218a;
  }
  s->float_exception_flags = s->float_exception_flags | 0x20;
  switch(rmode) {
  case 0:
    bVar15 = uVar8 == 0x4000000000000000;
    goto LAB_00cf22a0;
  case 1:
    if ((uVar12 >> 0x28 & 1) != 0) {
      return FVar4;
    }
    break;
  case 2:
    if ((uVar12 >> 0x28 & 1) == 0) {
      return FVar3;
    }
    break;
  case 3:
    break;
  case 4:
    uVar6 = 0x3fffffffffffffff;
    bVar15 = uVar8 == 0x3fffffffffffffff;
LAB_00cf22a0:
    if (uVar9 == 0xffffffff && (uVar6 <= uVar8 && !bVar15)) {
      return FVar2;
    }
    break;
  case 5:
    goto switchD_00cf220a_caseD_5;
  default:
    iVar5 = 0x804;
LAB_00cf22d0:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
               ,iVar5,(char *)0x0);
  }
  uVar13 = uVar13 & 0xffffff00ffffffff | 0x100000000;
LAB_00cf218a:
  FVar16.exp = (int)uVar13;
  FVar16.cls = (char)(uVar13 >> 0x20);
  FVar16.sign = (_Bool)(char)(uVar13 >> 0x28);
  FVar16._14_2_ = (short)(uVar13 >> 0x30);
  FVar16.frac = uVar8;
switchD_00cf220a_caseD_5:
  return FVar16;
}

Assistant:

static FloatParts round_to_int(FloatParts a, int rmode,
                               int scale, float_status *s)
{
    switch (a.cls) {
    case float_class_qnan:
    case float_class_snan:
        return return_nan(a, s);

    case float_class_zero:
    case float_class_inf:
        /* already "integral" */
        break;

    case float_class_normal:
        scale = MIN(MAX(scale, -0x10000), 0x10000);
        a.exp += scale;

        if (a.exp >= DECOMPOSED_BINARY_POINT) {
            /* already integral */
            break;
        }
        if (a.exp < 0) {
            bool one = false;
            /* all fractional */
            s->float_exception_flags |= float_flag_inexact;
            switch (rmode) {
            case float_round_nearest_even:
                one = a.exp == -1 && a.frac > DECOMPOSED_IMPLICIT_BIT;
                break;
            case float_round_ties_away:
                one = a.exp == -1 && a.frac >= DECOMPOSED_IMPLICIT_BIT;
                break;
            case float_round_to_zero:
                one = false;
                break;
            case float_round_up:
                one = !a.sign;
                break;
            case float_round_down:
                one = a.sign;
                break;
            case float_round_to_odd:
                one = true;
                break;
            default:
                g_assert_not_reached();
                break;
            }

            if (one) {
                a.frac = DECOMPOSED_IMPLICIT_BIT;
                a.exp = 0;
            } else {
                a.cls = float_class_zero;
            }
        } else {
            uint64_t frac_lsb = DECOMPOSED_IMPLICIT_BIT >> a.exp;
            uint64_t frac_lsbm1 = frac_lsb >> 1;
            uint64_t rnd_even_mask = (frac_lsb - 1) | frac_lsb;
            uint64_t rnd_mask = rnd_even_mask >> 1;
            uint64_t inc = 0;

            switch (rmode) {
            case float_round_nearest_even:
                inc = ((a.frac & rnd_even_mask) != frac_lsbm1 ? frac_lsbm1 : 0);
                break;
            case float_round_ties_away:
                inc = frac_lsbm1;
                break;
            case float_round_to_zero:
                inc = 0;
                break;
            case float_round_up:
                inc = a.sign ? 0 : rnd_mask;
                break;
            case float_round_down:
                inc = a.sign ? rnd_mask : 0;
                break;
            case float_round_to_odd:
                inc = a.frac & frac_lsb ? 0 : rnd_mask;
                break;
            default:
                g_assert_not_reached();
                break;
            }

            if (a.frac & rnd_mask) {
                s->float_exception_flags |= float_flag_inexact;
                a.frac += inc;
                a.frac &= ~rnd_mask;
                if (a.frac & DECOMPOSED_OVERFLOW_BIT) {
                    a.frac >>= 1;
                    a.exp++;
                }
            }
        }
        break;
    default:
        g_assert_not_reached();
    }
    return a;
}